

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

FollowPos * __thiscall
RegexTree::get_followpos(FollowPos *__return_storage_ptr__,RegexTree *this,StateMap *mp)

{
  FollowPos ret;
  allocator_type local_59;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_58;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_58,(mp->_M_h)._M_element_count + 1,(value_type *)&local_38,&local_59);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  generate_followpos(mp,&local_58,this->root);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

RegexTree::FollowPos RegexTree::get_followpos(const StateMap &mp) const {
    FollowPos ret(mp.size() + 1, std::vector<int>());
    generate_followpos(mp, ret, root);
    return std::move(ret);
}